

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_meth.c
# Opt level: O0

int BIO_get_new_index(void)

{
  int iVar1;
  CRYPTO_ONCE *in_RAX;
  int newval;
  int in_stack_0000000c;
  char *in_stack_00000010;
  int iVar2;
  
  iVar1 = CRYPTO_THREAD_run_once(in_RAX,(_func_void *)0x21c894);
  iVar2 = (int)in_RAX;
  if ((iVar1 == 0) || (do_bio_type_init_ossl_ret_ == 0)) {
    ERR_new();
    ERR_set_debug(in_stack_00000010,in_stack_0000000c,_newval);
    ERR_set_error(0x20,0xc0100,(char *)0x0);
    iVar2 = -1;
  }
  else {
    iVar1 = CRYPTO_UP_REF(&BIO_get_new_index::bio_count,(int *)&stack0xfffffffffffffff8,
                          bio_type_lock);
    if (iVar1 == 0) {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int BIO_get_new_index(void)
{
    static CRYPTO_REF_COUNT bio_count = BIO_TYPE_START;
    int newval;

    if (!RUN_ONCE(&bio_type_init, do_bio_type_init)) {
        ERR_raise(ERR_LIB_BIO, ERR_R_MALLOC_FAILURE);
        return -1;
    }
    if (!CRYPTO_UP_REF(&bio_count, &newval, bio_type_lock))
        return -1;
    return newval;
}